

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_cache_server.cpp
# Opt level: O0

void __thiscall cppcms::impl::tcp_cache_service::server::start_accept(server *this)

{
  server *s_00;
  io_service *f;
  element_type *peVar1;
  stream_socket *in_RDI;
  shared_ptr<cppcms::impl::tcp_cache_service::session> s;
  session *in_stack_ffffffffffffff58;
  shared_ptr<cppcms::impl::tcp_cache_service::session> *in_stack_ffffffffffffff60;
  server *in_stack_ffffffffffffff70;
  callback *pcVar2;
  stream_socket *p1;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 uVar3;
  intrusive_ptr<cppcms::impl::base_cache> *in_stack_ffffffffffffffc0;
  io_service *in_stack_ffffffffffffffc8;
  session *in_stack_ffffffffffffffd0;
  
  s_00 = (server *)operator_new(0xe0);
  uVar3 = 1;
  f = get_next_io_service(in_stack_ffffffffffffff70);
  booster::intrusive_ptr<cppcms::impl::base_cache>::intrusive_ptr
            ((intrusive_ptr<cppcms::impl::base_cache> *)in_stack_ffffffffffffff60,
             (intrusive_ptr<cppcms::impl::base_cache> *)in_stack_ffffffffffffff58);
  std::shared_ptr<cppcms::sessions::session_storage_factory>::shared_ptr
            ((shared_ptr<cppcms::sessions::session_storage_factory> *)in_stack_ffffffffffffff60,
             (shared_ptr<cppcms::sessions::session_storage_factory> *)in_stack_ffffffffffffff58);
  tcp_cache_service::session::session
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
             (shared_ptr<cppcms::sessions::session_storage_factory> *)
             CONCAT17(uVar3,in_stack_ffffffffffffffb8));
  std::shared_ptr<cppcms::impl::tcp_cache_service::session>::
  shared_ptr<cppcms::impl::tcp_cache_service::session,void>
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::shared_ptr<cppcms::sessions::session_storage_factory>::~shared_ptr
            ((shared_ptr<cppcms::sessions::session_storage_factory> *)0x482ebc);
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr
            ((intrusive_ptr<cppcms::impl::base_cache> *)in_stack_ffffffffffffff60);
  p1 = in_RDI;
  peVar1 = std::
           __shared_ptr_access<cppcms::impl::tcp_cache_service::session,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cppcms::impl::tcp_cache_service::session,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x482ee2);
  pcVar2 = (callback *)&peVar1->socket_;
  mfunc_to_event_handler<cppcms::impl::tcp_cache_service::server,cppcms::impl::tcp_cache_service::server*,std::shared_ptr<cppcms::impl::tcp_cache_service::session>,std::shared_ptr<cppcms::impl::tcp_cache_service::session>>
            ((offset_in_server_to_subr)f,s_00,
             (shared_ptr<cppcms::impl::tcp_cache_service::session> *)p1);
  booster::callback<void(std::error_code_const&)>::
  callback<booster::callable<void(std::error_code_const&)>>
            ((callback<void_(const_std::error_code_&)> *)in_RDI,
             (intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *)
             in_stack_ffffffffffffff58);
  booster::aio::acceptor::async_accept(in_RDI,pcVar2);
  booster::callback<void_(const_std::error_code_&)>::~callback
            ((callback<void_(const_std::error_code_&)> *)0x482f53);
  booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
            ((intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *)in_RDI);
  std::shared_ptr<cppcms::impl::tcp_cache_service::session>::~shared_ptr
            ((shared_ptr<cppcms::impl::tcp_cache_service::session> *)0x482f6a);
  return;
}

Assistant:

void start_accept()
	{
		booster::shared_ptr<session> s(new session(get_next_io_service(),cache_,sessions_));
		acceptor_.async_accept(s->socket_,mfunc_to_event_handler(&server::on_accept,this,s));
	}